

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O3

void __thiscall SecureDataManager::initObject(SecureDataManager *this)

{
  int iVar1;
  CryptoFactory *pCVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteString *this_00;
  MutexFactory *this_01;
  Mutex *pMVar3;
  ByteString local_38;
  
  pCVar2 = CryptoFactory::i();
  iVar1 = (*pCVar2->_vptr_CryptoFactory[8])(pCVar2,1);
  this->rng = (RNG *)CONCAT44(extraout_var,iVar1);
  pCVar2 = CryptoFactory::i();
  iVar1 = (**pCVar2->_vptr_CryptoFactory)(pCVar2,1);
  this->aes = (SymmetricAlgorithm *)CONCAT44(extraout_var_00,iVar1);
  this_00 = (ByteString *)operator_new(0x28);
  ByteString::ByteString(this_00);
  this->mask = this_00;
  (*this->rng->_vptr_RNG[2])(this->rng,this_00,0x20);
  this->soLoggedIn = false;
  this->userLoggedIn = false;
  ByteString::ByteString(&local_38,"524A52");
  ByteString::operator=(&this->magic,&local_38);
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  this_01 = MutexFactory::i();
  pMVar3 = MutexFactory::getMutex(this_01);
  this->dataMgrMutex = pMVar3;
  return;
}

Assistant:

void SecureDataManager::initObject()
{
	// Get an RNG instance
	rng = CryptoFactory::i()->getRNG();

	// Get an AES implementation
	aes = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::AES);

	// Initialise masking data
	mask = new ByteString();

	rng->generateRandom(*mask, 32);

	// Set the initial login state
	soLoggedIn = userLoggedIn = false;

	// Set the magic
	magic = ByteString("524A52"); // RJR

	// Get a mutex
	dataMgrMutex = MutexFactory::i()->getMutex();
}